

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O0

void __thiscall VTKCollection::append(VTKCollection *this,string *filename)

{
  ostream *poVar1;
  VTKCollection *in_RSI;
  ostream *in_RDI;
  
  if (((byte)in_RDI[0x200] & 1) == 0) {
    writeHeader(in_RSI);
  }
  poVar1 = std::operator<<(in_RDI,"<DataSet group=\"\" part=\"0\" timestep=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x208));
  poVar1 = std::operator<<(poVar1,"\" file=\"");
  poVar1 = std::operator<<(poVar1,(string *)in_RSI);
  std::operator<<(poVar1,"\" />\n");
  *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
  return;
}

Assistant:

void append(std::string filename)
  {
    if (!hasHeader_)
      writeHeader();
      
    outFile_ <<
      "<DataSet group=\"\" part=\"0\" timestep=\"" << recordID_ << "\" file=\"" << filename << "\" />\n";
    
    recordID_++;
  }